

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

void place_lregion(level *lev,xchar lx,xchar ly,xchar hx,xchar hy,xchar nlx,xchar nly,xchar nhx,
                  xchar nhy,xchar rtype,d_level *dest_lvl)

{
  char y;
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  branch *br;
  int iVar4;
  char local_68;
  
  local_68 = hy;
  if (lx == '\0') {
    ly = '\x01';
    hx = 'O';
    local_68 = '\x14';
    if (rtype == '\x03') {
      lx = '\x01';
      if (lev->nroom != 0) {
        br = Is_branchlev(&lev->z);
        place_branch(lev,br,'\0','\0');
        return;
      }
    }
    else {
      lx = '\x01';
    }
  }
  iVar4 = 200;
  do {
    uVar2 = mt_random();
    uVar3 = mt_random();
    bVar1 = put_lregion_here(lev,SUB161(ZEXT416(uVar2) % SEXT816(((long)hx - (long)lx) + 1),0) + lx,
                             SUB161(ZEXT416(uVar3) % SEXT816(((long)local_68 - (long)ly) + 1),0) +
                             ly,nlx,nly,nhx,nhy,rtype,ly == local_68 && lx == hx,dest_lvl);
    if (bVar1 != '\0') {
      return;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  do {
    y = ly;
    if (hx < lx) {
      impossible("Couldn\'t place lregion type %d!",(ulong)(uint)(int)rtype);
      return;
    }
    for (; y <= local_68; y = y + '\x01') {
      bVar1 = put_lregion_here(lev,lx,y,nlx,nly,nhx,nhy,rtype,'\x01',dest_lvl);
      if (bVar1 != '\0') {
        return;
      }
    }
    lx = lx + '\x01';
  } while( true );
}

Assistant:

void place_lregion(struct level *lev, xchar lx, xchar ly, xchar hx, xchar hy,
		   xchar nlx, xchar nly, xchar nhx, xchar nhy,
		   xchar rtype, d_level *dest_lvl)
{
    int trycnt;
    boolean oneshot;
    xchar x, y;

    if (!lx) { /* default to whole level */
	/*
	 * if there are rooms and this a branch, let place_branch choose
	 * the branch location (to avoid putting branches in corridors).
	 */
	if (rtype == LR_BRANCH && lev->nroom) {
	    place_branch(lev, Is_branchlev(&lev->z), 0, 0);
	    return;
	}

	lx = 1; hx = COLNO-1;
	ly = 1; hy = ROWNO-1;
    }

    /* first a probabilistic approach */
    oneshot = (lx == hx && ly == hy);
    for (trycnt = 0; trycnt < 200; trycnt++) {
	x = rn1((hx - lx) + 1, lx);
	y = rn1((hy - ly) + 1, ly);
	if (put_lregion_here(lev, x,y,nlx,nly,nhx,nhy,rtype,oneshot,dest_lvl))
	    return;
    }

    /* then a deterministic one */
    oneshot = TRUE;
    for (x = lx; x <= hx; x++)
	for (y = ly; y <= hy; y++)
	    if (put_lregion_here(lev, x,y,nlx,nly,nhx,nhy,rtype,oneshot,dest_lvl))
		return;

    impossible("Couldn't place lregion type %d!", rtype);
}